

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

typed_address<pstore::index::header_block> __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::flush(hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,transaction_base *transaction,uint generation)

{
  uint uVar1;
  uint uVar2;
  address aVar3;
  typed_address<pstore::index::header_block> extraout_RAX;
  index_pointer local_48;
  pair<std::shared_ptr<pstore::index::header_block>,_pstore::typed_address<pstore::index::header_block>_>
  pos;
  
  uVar1 = this->revision_;
  uVar2 = database::get_current_revision(transaction->db_);
  if (uVar1 != uVar2) {
    raise<pstore::error_code>(index_not_latest_revision);
  }
  aVar3.a_ = (value_type)(this->root_).internal_;
  if ((aVar3.a_ & 2) != 0) {
    if ((aVar3.a_ & 1) == 0) {
      assert_failed("root_.is_internal ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x412);
    }
    aVar3 = details::internal_node::flush
                      ((internal_node *)(aVar3.a_ & 0xfffffffffffffffc),transaction,0);
    (this->root_).addr_.a_ = aVar3.a_;
    if ((aVar3.a_ & 2) != 0) {
      assert_failed("root_.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x414);
    }
  }
  if (this->size_ != 0) {
    if ((aVar3.a_ & 2) != 0) {
      assert_failed("this->root ().is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x42b);
    }
    transaction_base::alloc_rw<pstore::index::header_block,void>(&pos,transaction,1);
    *(undefined8 *)
     ((pos.first.super___shared_ptr<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
     ->signature)._M_elems = 0x7264654878646e49;
    (pos.first.super___shared_ptr<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    size = this->size_;
    local_48 = this->root_;
    aVar3 = details::index_pointer::to_address((index_pointer *)&local_48.addr_);
    ((pos.first.super___shared_ptr<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->root).a_ = aVar3.a_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pos.first.
                super___shared_ptr<pstore::index::header_block,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::clear
            ((this->internals_container_)._M_t.
             super___uniq_ptr_impl<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
             .
             super__Head_base<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_false>
             ._M_head_impl);
  this->revision_ = generation;
  return (typed_address<pstore::index::header_block>)extraout_RAX.a_.a_;
}

Assistant:

typed_address<header_block>
        hamt_map<KeyType, ValueType, Hash, KeyEqual>::flush (transaction_base & transaction,
                                                             unsigned const generation) {
            if (revision_ != transaction.db ().get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            // If the root is a leaf, there's nothing to do. If not, we start to recursively flush
            // the tree.
            if (!root_.is_address ()) {
                PSTORE_ASSERT (root_.is_internal ());
                root_ = root_.untag<internal_node *> ()->flush (transaction, 0 /*shifts*/);
                PSTORE_ASSERT (root_.is_address ());
                // Don't delete the internal node here. They are owned by internals_container_. If
                // this ever changes, then use something like 'delete internal' here.
            }

            auto const header_addr = this->size () > 0U ? this->write_header_block (transaction)
                                                        : typed_address<header_block>::null ();

            // Release all of the in-heap internal nodes that we have now flushed.
            internals_container_->clear ();

            // Update the revision number into which the index will be flushed.
            revision_ = generation;

            return header_addr;
        }